

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_data_large.c
# Opt level: O0

void test_read_data_large(void)

{
  int iVar1;
  char *pcVar2;
  la_ssize_t v2;
  size_t v2_00;
  size_t local_38;
  size_t used;
  FILE *f;
  int tmpfilefd;
  char cStack_1c;
  char cStack_1b;
  char tmpfilename [10];
  archive *a;
  archive_entry *ae;
  
  f._6_1_ = 'l';
  f._7_1_ = 'a';
  tmpfilefd._0_1_ = 'r';
  tmpfilefd._1_1_ = 'g';
  tmpfilefd._2_1_ = 'e';
  tmpfilefd._3_1_ = 'f';
  cStack_1c = 'i';
  cStack_1b = 'l';
  tmpfilename[0] = 'e';
  tmpfilename[1] = '\0';
  tmpfilename._2_8_ = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'6',(uint)((archive *)tmpfilename._2_8_ != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_ustar((archive *)tmpfilename._2_8_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'7',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_write_add_filter_none((archive *)tmpfilename._2_8_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'8',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_write_open_memory((archive *)tmpfilename._2_8_,buff1,11000000,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'9',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff1, sizeof(buff1), &used)",
                   (void *)tmpfilename._2_8_);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'>',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,"file");
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  fill_with_pseudorandom_data(buff2,10000000);
  archive_entry_set_size((archive_entry *)a,10000000);
  iVar1 = archive_write_header((archive *)tmpfilename._2_8_,(archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'C',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",
                   (void *)tmpfilename._2_8_);
  archive_entry_free((archive_entry *)a);
  pcVar2 = (char *)archive_write_data((archive *)tmpfilename._2_8_,buff2,10000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'E',(uint)(pcVar2 == buff1 + 0x5bfd30),
                   "(int)sizeof(buff2) == archive_write_data(a, buff2, sizeof(buff2))",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_write_close((archive *)tmpfilename._2_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'H',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",
                      (void *)tmpfilename._2_8_);
  iVar1 = archive_write_free((archive *)tmpfilename._2_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  tmpfilename._2_8_ = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'L',(uint)((archive *)tmpfilename._2_8_ != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)tmpfilename._2_8_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'M',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_read_support_filter_all((archive *)tmpfilename._2_8_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'N',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_read_open_memory((archive *)tmpfilename._2_8_,buff1,11000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'O',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff1, sizeof(buff1))"
                   ,(void *)tmpfilename._2_8_);
  iVar1 = archive_read_next_header((archive *)tmpfilename._2_8_,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'P',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",
                   (void *)tmpfilename._2_8_);
  failure("Wrote 10MB, but didn\'t read the same amount");
  v2 = archive_read_data((archive *)tmpfilename._2_8_,buff3,10000000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'R',10000000,"sizeof(buff2)",v2,"archive_read_data(a, buff3, sizeof(buff3))"
                      ,(void *)tmpfilename._2_8_);
  failure("Read expected 10MB, but data read didn\'t match what was written");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'T',buff2,"buff2",buff3,"buff3",10000000,"sizeof(buff3)",(void *)0x0);
  iVar1 = archive_read_close((archive *)tmpfilename._2_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",
                      (void *)tmpfilename._2_8_);
  iVar1 = archive_read_free((archive *)tmpfilename._2_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  tmpfilename._2_8_ = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'Y',(uint)((archive *)tmpfilename._2_8_ != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)tmpfilename._2_8_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'Z',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_read_support_filter_all((archive *)tmpfilename._2_8_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'[',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_read_open_memory((archive *)tmpfilename._2_8_,buff1,11000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'\\',(uint)(iVar1 == 0),
                   "0 == archive_read_open_memory(a, buff1, sizeof(buff1))",
                   (void *)tmpfilename._2_8_);
  iVar1 = archive_read_next_header((archive *)tmpfilename._2_8_,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L']',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",
                   (void *)tmpfilename._2_8_);
  f._0_4_ = open((char *)((long)&f + 6),0x41,0x1ff);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'c',(uint)((int)f != 0),"tmpfilefd != 0",(void *)0x0);
  iVar1 = archive_read_data_into_fd((archive *)tmpfilename._2_8_,(int)f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'd',0,"0",(long)iVar1,"archive_read_data_into_fd(a, tmpfilefd)",
                      (void *)tmpfilename._2_8_);
  iVar1 = archive_read_close((archive *)tmpfilename._2_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",
                      (void *)tmpfilename._2_8_);
  iVar1 = archive_read_free((archive *)tmpfilename._2_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  close((int)f);
  used = (size_t)fopen((char *)((long)&f + 6),"rb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                   ,L'j',(uint)((FILE *)used != (FILE *)0x0),"f != NULL",(void *)0x0);
  v2_00 = fread(buff3,1,10000000,(FILE *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'k',10000000,"sizeof(buff3)",v2_00,"fread(buff3, 1, sizeof(buff3), f)",
                      (void *)0x0);
  fclose((FILE *)used);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_data_large.c"
                      ,L'm',buff2,"buff2",buff3,"buff3",10000000,"sizeof(buff3)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_data_large)
{
	struct archive_entry *ae;
	struct archive *a;
	char tmpfilename[] = "largefile";
	int tmpfilefd;
	FILE *f;
	size_t used;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff1, sizeof(buff1), &used));

	/*
	 * Write a file (with random contents) to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	fill_with_pseudorandom_data(buff2, sizeof(buff2));
	archive_entry_set_size(ae, sizeof(buff2));
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	assertA((int)sizeof(buff2) == archive_write_data(a, buff2, sizeof(buff2)));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Check that archive_read_data can handle 10*10^6 at a pop. */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff1, sizeof(buff1)));
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Wrote 10MB, but didn't read the same amount");
	assertEqualIntA(a, sizeof(buff2),archive_read_data(a, buff3, sizeof(buff3)));
	failure("Read expected 10MB, but data read didn't match what was written");
	assertEqualMem(buff2, buff3, sizeof(buff3));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Check archive_read_data_into_fd */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff1, sizeof(buff1)));
	assertA(0 == archive_read_next_header(a, &ae));
#if defined(__BORLANDC__)
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY);
#else
	tmpfilefd = open(tmpfilename, O_WRONLY | O_CREAT | O_BINARY, 0777);
#endif
	assert(tmpfilefd != 0);
	assertEqualIntA(a, 0, archive_read_data_into_fd(a, tmpfilefd));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	close(tmpfilefd);

	f = fopen(tmpfilename, "rb");
	assert(f != NULL);
	assertEqualInt(sizeof(buff3), fread(buff3, 1, sizeof(buff3), f));
	fclose(f);
	assertEqualMem(buff2, buff3, sizeof(buff3));
}